

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

bool __thiscall cmCTestMultiProcessHandler::CheckOutput(cmCTestMultiProcessHandler *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmCTestRunTest *pcVar2;
  bool bVar3;
  reference ppcVar4;
  reference ppcVar5;
  cmCTestTestProperties *pcVar6;
  pointer ppVar7;
  mapped_type_conflict1 *pmVar8;
  size_t sVar9;
  _Self local_c8;
  _Self local_c0;
  iterator j;
  bool testResult;
  cmCTestRunTest *pcStack_b0;
  int test;
  cmCTestRunTest *p_1;
  __normal_iterator<cmCTestRunTest_**,_std::vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_>_>
  local_a0;
  iterator i_1;
  cmCTestRunTest *local_88;
  cmCTestRunTest *p;
  _Self local_78;
  const_iterator i;
  string err;
  string out;
  vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_> finished;
  cmCTestMultiProcessHandler *this_local;
  
  bVar3 = std::set<cmCTestRunTest_*,_std::less<cmCTestRunTest_*>,_std::allocator<cmCTestRunTest_*>_>
          ::empty(&this->RunningTests);
  if (bVar3) {
    this_local._7_1_ = false;
  }
  else {
    std::vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_>::vector
              ((vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_> *)
               ((long)&out.field_2 + 8));
    std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&i);
    local_78._M_node =
         (_Base_ptr)
         std::set<cmCTestRunTest_*,_std::less<cmCTestRunTest_*>,_std::allocator<cmCTestRunTest_*>_>
         ::begin(&this->RunningTests);
    while( true ) {
      p = (cmCTestRunTest *)
          std::set<cmCTestRunTest_*,_std::less<cmCTestRunTest_*>,_std::allocator<cmCTestRunTest_*>_>
          ::end(&this->RunningTests);
      bVar3 = std::operator!=(&local_78,(_Self *)&p);
      if (!bVar3) break;
      ppcVar4 = std::_Rb_tree_const_iterator<cmCTestRunTest_*>::operator*(&local_78);
      local_88 = *ppcVar4;
      bVar3 = cmCTestRunTest::CheckOutput(local_88);
      if (!bVar3) {
        std::vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_>::push_back
                  ((vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_> *)
                   ((long)&out.field_2 + 8),&local_88);
      }
      std::_Rb_tree_const_iterator<cmCTestRunTest_*>::operator++(&local_78);
    }
    local_a0._M_current =
         (cmCTestRunTest **)
         std::vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_>::begin
                   ((vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_> *)
                    ((long)&out.field_2 + 8));
    while( true ) {
      p_1 = (cmCTestRunTest *)
            std::vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_>::end
                      ((vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_> *)
                       ((long)&out.field_2 + 8));
      bVar3 = __gnu_cxx::operator!=
                        (&local_a0,
                         (__normal_iterator<cmCTestRunTest_**,_std::vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_>_>
                          *)&p_1);
      if (!bVar3) break;
      this->Completed = this->Completed + 1;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmCTestRunTest_**,_std::vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_>_>
                ::operator*(&local_a0);
      pcStack_b0 = *ppcVar5;
      j._M_node._4_4_ = cmCTestRunTest::GetIndex(pcStack_b0);
      j._M_node._3_1_ = cmCTestRunTest::EndTest(pcStack_b0,this->Completed,this->Total,true);
      bVar3 = cmCTestRunTest::StartAgain(pcStack_b0);
      if (bVar3) {
        this->Completed = this->Completed - 1;
      }
      else {
        if ((j._M_node._3_1_ & 1) == 0) {
          pvVar1 = this->Failed;
          pcVar6 = cmCTestRunTest::GetTestProperties(pcStack_b0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvVar1,&pcVar6->Name);
        }
        else {
          pvVar1 = this->Passed;
          pcVar6 = cmCTestRunTest::GetTestProperties(pcStack_b0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvVar1,&pcVar6->Name);
        }
        local_c0._M_node =
             (_Base_ptr)
             std::
             map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
             ::begin(&(this->Tests).
                      super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                    );
        while( true ) {
          local_c8._M_node =
               (_Base_ptr)
               std::
               map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
               ::end(&(this->Tests).
                      super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                    );
          bVar3 = std::operator!=(&local_c0,&local_c8);
          if (!bVar3) break;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
                   operator->(&local_c0);
          std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                    (&(ppVar7->second).super_set<int,_std::less<int>,_std::allocator<int>_>,
                     (key_type *)((long)&j._M_node + 4));
          std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
          operator++(&local_c0);
        }
        pmVar8 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[](&this->TestFinishMap,(key_type *)((long)&j._M_node + 4));
        *pmVar8 = true;
        pmVar8 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[](&this->TestRunningMap,(key_type *)((long)&j._M_node + 4));
        *pmVar8 = false;
        std::set<cmCTestRunTest_*,_std::less<cmCTestRunTest_*>,_std::allocator<cmCTestRunTest_*>_>::
        erase(&this->RunningTests,&stack0xffffffffffffff50);
        WriteCheckpoint(this,j._M_node._4_4_);
        UnlockResources(this,j._M_node._4_4_);
        sVar9 = GetProcessorsUsed(this,j._M_node._4_4_);
        pcVar2 = pcStack_b0;
        this->RunningCount = this->RunningCount - sVar9;
        if (pcStack_b0 != (cmCTestRunTest *)0x0) {
          cmCTestRunTest::~cmCTestRunTest(pcStack_b0);
          operator_delete(pcVar2,0x260);
        }
      }
      __gnu_cxx::
      __normal_iterator<cmCTestRunTest_**,_std::vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_>_>
      ::operator++(&local_a0);
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
    std::vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_>::~vector
              ((vector<cmCTestRunTest_*,_std::allocator<cmCTestRunTest_*>_> *)
               ((long)&out.field_2 + 8));
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestMultiProcessHandler::CheckOutput()
{
  // no more output we are done
  if (this->RunningTests.empty()) {
    return false;
  }
  std::vector<cmCTestRunTest*> finished;
  std::string out, err;
  for (std::set<cmCTestRunTest*>::const_iterator i =
         this->RunningTests.begin();
       i != this->RunningTests.end(); ++i) {
    cmCTestRunTest* p = *i;
    if (!p->CheckOutput()) {
      finished.push_back(p);
    }
  }
  for (std::vector<cmCTestRunTest*>::iterator i = finished.begin();
       i != finished.end(); ++i) {
    this->Completed++;
    cmCTestRunTest* p = *i;
    int test = p->GetIndex();

    bool testResult = p->EndTest(this->Completed, this->Total, true);
    if (p->StartAgain()) {
      this->Completed--; // remove the completed test because run again
      continue;
    }
    if (testResult) {
      this->Passed->push_back(p->GetTestProperties()->Name);
    } else {
      this->Failed->push_back(p->GetTestProperties()->Name);
    }
    for (TestMap::iterator j = this->Tests.begin(); j != this->Tests.end();
         ++j) {
      j->second.erase(test);
    }
    this->TestFinishMap[test] = true;
    this->TestRunningMap[test] = false;
    this->RunningTests.erase(p);
    this->WriteCheckpoint(test);
    this->UnlockResources(test);
    this->RunningCount -= GetProcessorsUsed(test);
    delete p;
  }
  return true;
}